

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O3

BOOL __thiscall
LASquadtree::tiling_setup(LASquadtree *this,F32 min_x,F32 max_x,F32 min_y,F32 max_y,U32 levels)

{
  this->min_x = min_x;
  this->max_x = max_x;
  this->min_y = min_y;
  this->max_y = max_y;
  this->levels = levels;
  this->sub_level = 0;
  this->sub_level_index = 0;
  return true;
}

Assistant:

BOOL LASquadtree::tiling_setup(F32 min_x, F32 max_x, F32 min_y, F32 max_y, U32 levels)
{
  this->min_x = min_x;
  this->max_x = max_x;
  this->min_y = min_y;
  this->max_y = max_y;
  this->levels = levels;
  this->sub_level = 0;
  this->sub_level_index = 0;
  return TRUE;
}